

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_softmax_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::FastSoftmaxTest_DISABLED_Speed_Test::~FastSoftmaxTest_DISABLED_Speed_Test
          (FastSoftmaxTest_DISABLED_Speed_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__FastSoftmaxTest_01052070;
  *(undefined ***)this = &PTR__FastSoftmaxTest_010520b0;
  if (*(void **)(this + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x28));
  }
  *(undefined8 *)(this + 0x28) = 0;
  if (*(void **)(this + 0x20) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x20));
  }
  *(undefined8 *)(this + 0x20) = 0;
  if (*(void **)(this + 0x18) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x18));
  }
  *(undefined8 *)(this + 0x18) = 0;
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x10));
  operator_delete((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                   *)(this + -0x10));
  return;
}

Assistant:

TEST_P(FastSoftmaxTest, DISABLED_Speed) {
  constexpr int kNumTimes = 1000000;
  RunSoftmaxSpeedTest(kNumTimes);
}